

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

bool __thiscall MemoryManager::copyFrom(MemoryManager *this,void *src,uint32_t dest,uint32_t len)

{
  bool bVar1;
  uint in_ECX;
  uint32_t in_EDX;
  MemoryManager *in_RSI;
  undefined8 in_RDI;
  uint32_t i;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    if (in_ECX <= uVar2) {
      return true;
    }
    bVar1 = isAddrExist((MemoryManager *)CONCAT44(uVar2,in_stack_ffffffffffffffd8),
                        (uint32_t)((ulong)in_RDI >> 0x20));
    if (!bVar1) break;
    setByte(in_RSI,in_EDX,(uint8_t)(in_ECX >> 0x18),
            (uint32_t *)CONCAT44(uVar2,in_stack_ffffffffffffffd8));
    uVar2 = uVar2 + 1;
  }
  dbgprintf("Data copy to invalid addr 0x%x!\n",(ulong)(in_EDX + uVar2));
  return false;
}

Assistant:

bool MemoryManager::copyFrom(const void *src, uint32_t dest, uint32_t len) {
  for (uint32_t i = 0; i < len; ++i) {
    if (!this->isAddrExist(dest + i)) {
      dbgprintf("Data copy to invalid addr 0x%x!\n", dest + i);
      return false;
    }
    this->setByte(dest + i, ((uint8_t *)src)[i]);
  }
  return true;
}